

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlPointerListPtr xmlPointerListCreate(int initialSize)

{
  xmlPointerListPtr ret;
  xmlPointerListPtr pxStack_10;
  int initialSize_local;
  
  pxStack_10 = (xmlPointerListPtr)(*xmlMalloc)(0x10);
  if (pxStack_10 == (xmlPointerListPtr)0x0) {
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"xmlPointerListCreate: allocating item\n");
    pxStack_10 = (xmlPointerListPtr)0x0;
  }
  else {
    memset(pxStack_10,0,0x10);
    if (0 < initialSize) {
      xmlPointerListAddSize(pxStack_10,(void *)0x0,initialSize);
      pxStack_10->number = 0;
    }
  }
  return pxStack_10;
}

Assistant:

static xmlPointerListPtr
xmlPointerListCreate(int initialSize)
{
    xmlPointerListPtr ret;

    ret = xmlMalloc(sizeof(xmlPointerList));
    if (ret == NULL) {
	xmlXPathErrMemory(NULL,
	    "xmlPointerListCreate: allocating item\n");
	return (NULL);
    }
    memset(ret, 0, sizeof(xmlPointerList));
    if (initialSize > 0) {
	xmlPointerListAddSize(ret, NULL, initialSize);
	ret->number = 0;
    }
    return (ret);
}